

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiTable::ImGuiTable(ImGuiTable *this)

{
  void *in_RDI;
  ImRect *in_stack_ffffffffffffffd0;
  
  ImSpan<ImGuiTableColumn>::ImSpan((ImSpan<ImGuiTableColumn> *)((long)in_RDI + 0x18));
  ImSpan<signed_char>::ImSpan((ImSpan<signed_char> *)((long)in_RDI + 0x28));
  ImSpan<ImGuiTableCellData>::ImSpan((ImSpan<ImGuiTableCellData> *)((long)in_RDI + 0x38));
  ImRect::ImRect(in_stack_ffffffffffffffd0);
  ImRect::ImRect(in_stack_ffffffffffffffd0);
  ImRect::ImRect(in_stack_ffffffffffffffd0);
  ImRect::ImRect(in_stack_ffffffffffffffd0);
  ImRect::ImRect(in_stack_ffffffffffffffd0);
  ImRect::ImRect(in_stack_ffffffffffffffd0);
  ImRect::ImRect(in_stack_ffffffffffffffd0);
  ImRect::ImRect(in_stack_ffffffffffffffd0);
  ImRect::ImRect(in_stack_ffffffffffffffd0);
  ImGuiTextBuffer::ImGuiTextBuffer((ImGuiTextBuffer *)0x577837);
  ImGuiTableInstanceData::ImGuiTableInstanceData((ImGuiTableInstanceData *)((long)in_RDI + 0x1a8));
  ImVector<ImGuiTableInstanceData>::ImVector
            ((ImVector<ImGuiTableInstanceData> *)((long)in_RDI + 0x1b0));
  ImGuiTableColumnSortSpecs::ImGuiTableColumnSortSpecs((ImGuiTableColumnSortSpecs *)0x577873);
  ImVector<ImGuiTableColumnSortSpecs>::ImVector
            ((ImVector<ImGuiTableColumnSortSpecs> *)((long)in_RDI + 0x1d0));
  ImGuiTableSortSpecs::ImGuiTableSortSpecs((ImGuiTableSortSpecs *)0x57789d);
  memset(in_RDI,0,0x218);
  *(undefined4 *)((long)in_RDI + 0x70) = 0xffffffff;
  return;
}

Assistant:

ImGuiTable()                { memset(this, 0, sizeof(*this)); LastFrameActive = -1; }